

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

void visuals_color_cycle_free(visuals_color_cycle *cycle)

{
  if (cycle != (visuals_color_cycle *)0x0) {
    if (cycle->steps != (uint8_t *)0x0) {
      mem_free(cycle->steps);
      cycle->steps = (uint8_t *)0x0;
    }
    if (cycle->cycle_name != (char *)0x0) {
      string_free(cycle->cycle_name);
      cycle->cycle_name = (char *)0x0;
    }
    mem_free(cycle);
    return;
  }
  return;
}

Assistant:

static void visuals_color_cycle_free(struct visuals_color_cycle *cycle)
{
	if (cycle == NULL) {
		return;
	}

	if (cycle->steps != NULL) {
		mem_free(cycle->steps);
		cycle->steps = NULL;
	}

	if (cycle->cycle_name != NULL) {
		string_free(cycle->cycle_name);
		cycle->cycle_name = NULL;
	}

	mem_free(cycle);
	cycle = NULL;
}